

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBuildVisitor.cpp
# Opt level: O0

void __thiscall CBuildVisitor::Visit(CBuildVisitor *this,CIdExp *expression)

{
  CExpressionWrapper *this_00;
  element_type *peVar1;
  element_type *peVar2;
  undefined1 local_50 [8];
  shared_ptr<VariableInfo> varInfo;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_30;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_28;
  __node_base_ptr local_20;
  IAddress *address;
  CIdExp *expression_local;
  CBuildVisitor *this_local;
  
  address = (IAddress *)expression;
  expression_local = (CIdExp *)this;
  std::operator<<((ostream *)&std::cout,"IRT builder: CIdExp\n");
  local_20 = (__node_base_ptr)
             IRT::CFrame::GetLocalVisibilityAddress(this->currentFrame,(string *)(address + 3));
  if (local_20 != (__node_base_ptr)0x0) {
    this_00 = (CExpressionWrapper *)operator_new(0x10);
    varInfo.super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._3_1_ = 1
    ;
    (*(code *)local_20->_M_nxt[2]._M_nxt)(&local_30);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_28,&local_30);
    IRT::CExpressionWrapper::CExpressionWrapper(this_00,&local_28);
    varInfo.super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._3_1_ = 0
    ;
    updateSubtreeWrapper(this,(ISubtreeWrapper *)this_00);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_28);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_30);
    getVariableInfoFromLocalArgAndFields
              ((SymbolTable *)local_50,(string *)this->symbolTable,&this->currentClassName,
               &this->currentMethod);
    peVar1 = std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_50);
    peVar2 = std::__shared_ptr_access<TypeInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<TypeInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &peVar1->type);
    if ((peVar2->isPrimitive & 1U) == 0) {
      peVar1 = std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_50);
      peVar2 = std::__shared_ptr_access<TypeInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<TypeInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )&peVar1->type);
      std::__cxx11::string::operator=
                ((string *)&this->currentObjectClassName,(string *)&peVar2->className);
    }
    else {
      std::__cxx11::string::operator=((string *)&this->currentObjectClassName,"");
    }
    std::shared_ptr<VariableInfo>::~shared_ptr((shared_ptr<VariableInfo> *)local_50);
    return;
  }
  __assert_fail("address != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/visitors/CBuildVisitor.cpp"
                ,0x11,"virtual void CBuildVisitor::Visit(CIdExp &)");
}

Assistant:

void CBuildVisitor::Visit( CIdExp &expression ) {
    std::cout << "IRT builder: CIdExp\n";
    const IRT::IAddress *address = currentFrame->GetLocalVisibilityAddress( expression.name );

    assert( address != NULL );

    updateSubtreeWrapper( new IRT::CExpressionWrapper(
            std::move( address->ToExpression( ))
    ));

    auto varInfo = getVariableInfoFromLocalArgAndFields( symbolTable, currentClassName, currentMethod,
                                                         expression.name );
    if ( varInfo->type->isPrimitive ) {
        currentObjectClassName = "";
    } else {
        currentObjectClassName = varInfo->type->className;
    }
}